

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O1

void __thiscall
AmstradCPC::ConcreteMachine<true>::ConcreteMachine
          (ConcreteMachine<true> *this,Target *target,ROMFetcher *rom_fetcher)

{
  CRTCBusHandler *this_00;
  uint8_t *ram;
  AYDeferrer *this_01;
  KeyboardState *this_02;
  FDC *this_03;
  Observer *pOVar1;
  Source *pSVar2;
  pointer puVar3;
  bool bVar4;
  bool bVar5;
  int c;
  long lVar6;
  pointer pNVar7;
  pointer pNVar8;
  pointer pNVar9;
  undefined4 *puVar10;
  uint uVar11;
  int iVar12;
  Name name;
  Name name_00;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  undefined1 local_e8 [8];
  undefined1 auStack_e0 [8];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_d8;
  pointer pNStack_c0;
  undefined1 local_b8 [16];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_a8;
  AYDeferrer *local_90;
  CRTCBusHandler *local_88;
  Processor<AmstradCPC::ConcreteMachine<true>,_false,_true> *local_80;
  _Any_data *local_78;
  Request local_70;
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_48;
  
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_00598440;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_005983e0;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00593df0;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&PTR___cxa_pure_virtual_00598410;
  local_d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8 = (undefined1  [8])0x0;
  auStack_e0._0_4_ = Any;
  auStack_e0._4_4_ = None;
  pNStack_c0 = (pointer)0x0;
  local_d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auStack_e0;
  local_d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)auStack_e0;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)local_e8);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)local_e8);
  (this->super_TypeRecipient<AmstradCPC::CharacterMapper>).typer_._M_t.
  super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  (this->super_TypeRecipient<AmstradCPC::CharacterMapper>).previous_typer_._M_t.
  super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  (this->super_TypeRecipient<AmstradCPC::CharacterMapper>).character_mapper.super_CharacterMapper.
  _vptr_CharacterMapper = (_func_int **)&PTR__CharacterMapper_00599640;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_005989b0;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00598a78;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00598a90;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00598ad8;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_00598af0;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00598b20;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00598b60;
  (this->super_TypeRecipient<AmstradCPC::CharacterMapper>).super_Delegate.super_KeyActions.
  _vptr_KeyActions = (_func_int **)&PTR_set_key_state_00598b78;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_00598bb8;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00598bd0;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00598bf0;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00598c10;
  CPU::Z80::Processor<AmstradCPC::ConcreteMachine<true>,_false,_true>::Processor(&this->z80_,this);
  this_00 = &this->crtc_bus_handler_;
  ram = this->ram_;
  local_80 = &this->z80_;
  CRTCBusHandler::CRTCBusHandler(this_00,ram,&this->interrupt_timer_);
  (this->crtc_).bus_handler_ = this_00;
  (this->crtc_).bus_state_.field_count = 0;
  (this->crtc_).bus_state_.display_enable = false;
  (this->crtc_).bus_state_.hsync = false;
  (this->crtc_).bus_state_.vsync = false;
  (this->crtc_).bus_state_.cursor = false;
  (this->crtc_).bus_state_.refresh_address = 0;
  (this->crtc_).bus_state_.row_address = 0;
  (this->crtc_).layout_.interlace_mode_ = Off;
  (this->crtc_).line_address_ = 0;
  (this->crtc_).end_of_line_address_ = 0;
  (this->crtc_).status_ = '\0';
  (this->crtc_).selected_register_ = 0;
  (this->crtc_).character_counter_ = '\0';
  (this->crtc_).line_counter_ = '\0';
  (this->crtc_).character_is_visible_ = false;
  (this->crtc_).line_is_visible_ = false;
  (this->crtc_).hsync_counter_ = 0;
  (this->crtc_).vsync_counter_ = 0;
  (this->crtc_).is_in_adjustment_period_ = false;
  (this->crtc_).registers_[0] = '\0';
  (this->crtc_).registers_[1] = '\0';
  (this->crtc_).registers_[2] = '\0';
  (this->crtc_).registers_[3] = '\0';
  (this->crtc_).registers_[4] = '\0';
  (this->crtc_).registers_[5] = '\0';
  (this->crtc_).registers_[6] = '\0';
  (this->crtc_).registers_[7] = '\0';
  (this->crtc_).registers_[8] = '\0';
  (this->crtc_).registers_[9] = '\0';
  (this->crtc_).registers_[10] = '\0';
  (this->crtc_).registers_[0xb] = '\0';
  (this->crtc_).registers_[0xc] = '\0';
  (this->crtc_).registers_[0xd] = '\0';
  (this->crtc_).registers_[0xe] = '\0';
  (this->crtc_).registers_[0xf] = '\0';
  *(undefined4 *)((this->crtc_).registers_ + 0xf) = 0;
  (this->crtc_).display_skew_mask_ = 1;
  (this->crtc_).character_is_visible_shifter_ = 0;
  (this->crtc_).is_cursor_line_ = false;
  this_01 = &this->ay_;
  local_88 = this_00;
  local_78 = (_Any_data *)rom_fetcher;
  AYDeferrer::AYDeferrer(this_01);
  this_02 = &this->key_state_;
  (this->i8255_port_handler_).ay_ = this_01;
  (this->i8255_port_handler_).crtc_ = &this->crtc_;
  (this->i8255_port_handler_).key_state_ = this_02;
  (this->i8255_port_handler_).tape_player_ = &this->tape_player_;
  (this->i8255_).control_ = '\0';
  (this->i8255_).outputs_[0] = '\0';
  (this->i8255_).outputs_[1] = '\0';
  (this->i8255_).outputs_[2] = '\0';
  (this->i8255_).port_handler_ = &this->i8255_port_handler_;
  this_03 = &this->fdc_;
  local_90 = this_01;
  Amstrad::FDC::FDC(this_03,(Cycles)0x7a1200);
  (this->interrupt_timer_).timer_ = 0;
  (this->time_since_fdc_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  *(undefined8 *)((long)&(this->time_since_fdc_update_).super_WrappedInt<HalfCycles>.length_ + 6) =
       0;
  Storage::Tape::BinaryTapePlayer::BinaryTapePlayer(&this->tape_player_,8000000);
  pOVar1 = &this->super_Observer;
  (this->tape_crc_).
  super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.value_ =
       0xffff;
  lVar6 = 0;
  do {
    uVar11 = (int)lVar6 << 8;
    iVar12 = 8;
    do {
      uVar11 = uVar11 * 2 ^ (uint)(int)(short)uVar11 >> 0xf & 0x1021;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    (this->tape_crc_).
    super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
    xor_table[lVar6] = (unsigned_short)uVar11;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  this->use_fast_tape_hack_ = false;
  this->allow_fast_tape_hack_ = false;
  (this->clock_offset_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->crtc_counter_).super_WrappedInt<HalfCycles>.length_ = 4;
  this->roms_[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->roms_[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->roms_[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->roms_[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->roms_[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->roms_[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->roms_[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->roms_[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->roms_[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->half_cycles_since_ay_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  *(undefined4 *)
   ((long)&(this->half_cycles_since_ay_update_).super_WrappedInt<HalfCycles>.length_ + 7) = 0;
  this->upper_rom_is_paged_ = false;
  this->ram_pages_[0] = (uint8_t *)0x0;
  this->ram_pages_[1] = (uint8_t *)0x0;
  this->ram_pages_[2] = (uint8_t *)0x0;
  this->ram_pages_[3] = (uint8_t *)0x0;
  this->read_pointers_[0] = (uint8_t *)0x0;
  this->read_pointers_[1] = (uint8_t *)0x0;
  this->read_pointers_[2] = (uint8_t *)0x0;
  this->read_pointers_[3] = (uint8_t *)0x0;
  this->write_pointers_[2] = (uint8_t *)0x0;
  this->write_pointers_[3] = (uint8_t *)0x0;
  this->write_pointers_[0] = (uint8_t *)0x0;
  this->write_pointers_[1] = (uint8_t *)0x0;
  KeyboardState::KeyboardState(this_02);
  (this->keyboard_mapper_).super_KeyboardMapper._vptr_KeyboardMapper =
       (_func_int **)&PTR_mapped_key_for_key_00599610;
  this->has_run_ = false;
  (this->super_TimedMachine).clock_rate_ = 4000000.0;
  Memory::Fuzz(ram,0x20000);
  (this->fdc_).super_i8272.super_MFMController.super_Controller.super_Source.observer_ = pOVar1;
  uVar11 = (**(this->fdc_).super_i8272.super_MFMController.super_Controller.super_Source.
              _vptr_Source)(this_03);
  (**pOVar1->_vptr_Observer)(pOVar1,this_03,(ulong)uVar11);
  pSVar2 = &(this->tape_player_).super_TapePlayer.super_Source;
  (this->tape_player_).super_TapePlayer.super_Source.observer_ = pOVar1;
  uVar11 = (**(this->tape_player_).super_TapePlayer.super_Source._vptr_Source)(pSVar2);
  (**pOVar1->_vptr_Observer)(pOVar1,pSVar2,(ulong)uVar11);
  GI::AY38910::AY38910SampleSource<true>::set_port_handler
            (&(this->ay_).ay_.super_AY38910SampleSource<true>,&this_02->super_PortHandler);
  if (target->model == CPC464) {
    name_00 = CPC464Firmware;
    name = CPC464BASIC;
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if (target->model == CPC664) {
      name_00 = CPC664Firmware;
      name = CPC664BASIC;
    }
    else {
      name_00 = CPC6128Firmware;
      name = CPC6128BASIC;
    }
  }
  ROM::Request::Request((Request *)local_e8,name_00,false);
  ROM::Request::Request(&local_70,name,false);
  ROM::Request::operator&&((Request *)local_b8,(Request *)local_e8,&local_70);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&local_70.node.children);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_d8);
  if (bVar4) {
    ROM::Request::Request(&local_70,AMSDOS,false);
    ROM::Request::operator&&((Request *)local_e8,(Request *)local_b8,&local_70);
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_b8[8] = auStack_e0[0];
    local_b8._0_8_ = local_e8;
    local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_48);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_d8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_70.node.children);
  }
  if (*(long *)(local_78 + 1) == 0) {
    std::__throw_bad_function_call();
  }
  (**(code **)((long)local_78 + 0x18))
            ((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_e8,local_78,(Request *)local_b8);
  bVar5 = ROM::Request::validate((Request *)local_b8,(Map *)local_e8);
  if (!bVar5) {
    puVar10 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar10 = 0;
    __cxa_throw(puVar10,&ROMMachine::Error::typeinfo,0);
  }
  pNVar8 = (pointer)auStack_e0;
  pNVar9 = local_d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (bVar4) {
    pNVar7 = (pointer)auStack_e0;
    for (; pNVar9 != (pointer)0x0;
        pNVar9 = (&(pNVar9->children).
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_start)[iVar12 < 0x12]) {
      iVar12 = *(int *)&(pNVar9->children).
                        super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (0x11 < iVar12) {
        pNVar7 = pNVar9;
      }
    }
    pNVar9 = (pointer)auStack_e0;
    if ((pNVar7 != (pointer)auStack_e0) &&
       (*(int *)&(pNVar7->children).
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage < 0x13)) {
      pNVar9 = pNVar7;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (this->roms_,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pNVar9 + 1));
    pNVar9 = local_d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  for (; pNVar9 != (pointer)0x0;
      pNVar9 = (&(pNVar9->children).
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_start)[iVar12 < (int)name_00]) {
    iVar12 = *(int *)&(pNVar9->children).
                      super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((int)name_00 <= iVar12) {
      pNVar8 = pNVar9;
    }
  }
  pNVar9 = (pointer)auStack_e0;
  if ((pNVar8 != (pointer)auStack_e0) &&
     (pNVar9 = pNVar8,
     (int)name_00 <
     *(int *)&(pNVar8->children).
              super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)) {
    pNVar9 = (pointer)auStack_e0;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (this->roms_ + 1,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pNVar9 + 1));
  pNVar9 = (pointer)auStack_e0;
  for (pNVar8 = local_d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar8 != (pointer)0x0;
      pNVar8 = (&(pNVar8->children).
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_start)[iVar12 < (int)name]) {
    iVar12 = *(int *)&(pNVar8->children).
                      super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((int)name <= iVar12) {
      pNVar9 = pNVar8;
    }
  }
  pNVar8 = (pointer)auStack_e0;
  if ((pNVar9 != (pointer)auStack_e0) &&
     (*(int *)&(pNVar9->children).
               super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage <= (int)name)) {
    pNVar8 = pNVar9;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (this->roms_ + 2,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pNVar8 + 1));
  this->upper_rom_is_paged_ = true;
  this->upper_rom_ = BASIC;
  this->write_pointers_[0] = ram;
  this->write_pointers_[1] = this->ram_ + 0x4000;
  this->write_pointers_[2] = this->ram_ + 0x8000;
  this->write_pointers_[3] = this->ram_ + 0xc000;
  puVar3 = this->roms_[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->read_pointers_[0] =
       this->roms_[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->read_pointers_[1] = this->ram_ + 0x4000;
  this->read_pointers_[2] = this->ram_ + 0x8000;
  this->read_pointers_[3] = puVar3;
  this->has_128k_ = target->model == CPC6128;
  if ((target->loading_command)._M_string_length != 0) {
    Utility::TypeRecipient<AmstradCPC::CharacterMapper>::add_typer
              (&this->super_TypeRecipient<AmstradCPC::CharacterMapper>,&target->loading_command);
  }
  insert_media(this,&(target->super_Target).media);
  std::
  _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)local_e8);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_a8);
  return;
}

Assistant:

ConcreteMachine(const Analyser::Static::AmstradCPC::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			z80_(*this),
			crtc_bus_handler_(ram_, interrupt_timer_),
			crtc_(crtc_bus_handler_),
			i8255_port_handler_(key_state_, crtc_, ay_, tape_player_),
			i8255_(i8255_port_handler_),
			tape_player_(8000000),
			crtc_counter_(HalfCycles(4))	// This starts the CRTC exactly out of phase with the CPU's memory accesses
		{
			// primary clock is 4Mhz
			set_clock_rate(4000000);

			// ensure memory starts in a random state
			Memory::Fuzz(ram_, sizeof(ram_));

			// register this class as the sleep observer for the FDC and tape
			fdc_.set_clocking_hint_observer(this);
			tape_player_.set_clocking_hint_observer(this);

			// install the keyboard state class as the AY port handler
			ay_.ay().set_port_handler(&key_state_);

			// construct the list of necessary ROMs
			bool has_amsdos = false;
			ROM::Name firmware, basic;

			using Model = Analyser::Static::AmstradCPC::Target::Model;
			switch(target.model) {
				case Model::CPC464:
					firmware = ROM::Name::CPC464Firmware;
					basic = ROM::Name::CPC464BASIC;
				break;
				case Model::CPC664:
					firmware = ROM::Name::CPC664Firmware;
					basic = ROM::Name::CPC664BASIC;
					has_amsdos = true;
				break;
				default:
					firmware = ROM::Name::CPC6128Firmware;
					basic = ROM::Name::CPC6128BASIC;
					has_amsdos = true;
				break;
			}

			ROM::Request request = ROM::Request(firmware) && ROM::Request(basic);
			if(has_amsdos) {
				request = request && ROM::Request(ROM::Name::AMSDOS);
			}

			// Fetch and verify the ROMs.
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			if(has_amsdos) {
				roms_[ROMType::AMSDOS] = roms.find(ROM::Name::AMSDOS)->second;
			}
			roms_[ROMType::OS] = roms.find(firmware)->second;
			roms_[ROMType::BASIC] = roms.find(basic)->second;

			// Establish default memory map
			upper_rom_is_paged_ = true;
			upper_rom_ = ROMType::BASIC;

			write_pointers_[0] = &ram_[0x0000];
			write_pointers_[1] = &ram_[0x4000];
			write_pointers_[2] = &ram_[0x8000];
			write_pointers_[3] = &ram_[0xc000];

			read_pointers_[0] = roms_[ROMType::OS].data();
			read_pointers_[1] = write_pointers_[1];
			read_pointers_[2] = write_pointers_[2];
			read_pointers_[3] = roms_[upper_rom_].data();

			// Set total RAM available.
			has_128k_ = target.model == Model::CPC6128;

			// Type whatever is required.
			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
			}

			insert_media(target.media);
		}